

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O0

int jaegertracing::net::anon_unknown_1::decodeHex(char ch)

{
  int local_c;
  char ch_local;
  
  if ((ch < '0') || ('9' < ch)) {
    if ((ch < 'A') || ('F' < ch)) {
      if (ch < 'a' || 'f' < ch) {
        __assert_fail("ch >= \'a\' && ch <= \'f\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/net/URI.cpp"
                      ,0x2c,"int jaegertracing::net::(anonymous namespace)::decodeHex(char)");
      }
      local_c = ch + -0x57;
    }
    else {
      local_c = ch + -0x37;
    }
  }
  else {
    local_c = ch + -0x30;
  }
  return local_c;
}

Assistant:

int decodeHex(char ch)
{
    if (ch >= '0' && ch <= '9') {
        return ch - '0';
    }
    if (ch >= 'A' && ch <= 'F') {
        return ch - 'A' + 10;
    }
    assert(ch >= 'a' && ch <= 'f');
    return ch - 'a' + 10;
}